

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * dbReallocFinish(sqlite3 *db,void *p,u64 n)

{
  int iVar1;
  sqlite3 *db_00;
  void *in_RDX;
  void *in_RSI;
  sqlite3 *in_RDI;
  void *pNew;
  void *in_stack_ffffffffffffffc8;
  sqlite3 *in_stack_ffffffffffffffd0;
  sqlite3 *in_stack_ffffffffffffffd8;
  sqlite3 *nBytes;
  
  nBytes = (sqlite3 *)0x0;
  if (in_RDI->mallocFailed == '\0') {
    iVar1 = isLookaside(in_RDI,in_RSI);
    if (iVar1 == 0) {
      nBytes = (sqlite3 *)sqlite3Realloc(in_RDX,(u64)nBytes);
      if (nBytes == (sqlite3 *)0x0) {
        sqlite3OomFault(in_stack_ffffffffffffffd0);
      }
    }
    else {
      db_00 = (sqlite3 *)
              sqlite3DbMallocRawNN(in_stack_ffffffffffffffd8,(u64)in_stack_ffffffffffffffd0);
      nBytes = db_00;
      if (db_00 != (sqlite3 *)0x0) {
        iVar1 = lookasideMallocSize(in_RDI,in_RSI);
        memcpy(db_00,in_RSI,(long)iVar1);
        sqlite3DbFree(db_00,in_stack_ffffffffffffffc8);
      }
    }
  }
  return nBytes;
}

Assistant:

static SQLITE_NOINLINE void *dbReallocFinish(sqlite3 *db, void *p, u64 n){
  void *pNew = 0;
  assert( db!=0 );
  assert( p!=0 );
  if( db->mallocFailed==0 ){
    if( isLookaside(db, p) ){
      pNew = sqlite3DbMallocRawNN(db, n);
      if( pNew ){
        memcpy(pNew, p, lookasideMallocSize(db, p));
        sqlite3DbFree(db, p);
      }
    }else{
      assert( sqlite3MemdebugHasType(p, (MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      assert( sqlite3MemdebugNoType(p, (u8)~(MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      pNew = sqlite3Realloc(p, n);
      if( !pNew ){
        sqlite3OomFault(db);
      }
      sqlite3MemdebugSetType(pNew,
            (db->lookaside.bDisable==0 ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
    }
  }
  return pNew;
}